

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevolute.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkRevolute::IntStateScatterReactions
          (ChLinkRevolute *this,uint off_L,ChVectorDynamic<> *L)

{
  ChMatrix33<double> *pCVar1;
  double dVar2;
  int iVar3;
  CoeffReturnType pdVar4;
  undefined1 auVar5 [16];
  ChVector<double> v;
  ChVector<double> u1;
  ChVector<double> T2;
  ChMatrix33<double> mat2;
  ChVector<double> v1;
  ChVector<double> F2;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_150;
  double local_148;
  undefined8 uStack_140;
  double local_138;
  undefined8 uStack_130;
  ChVector<double> local_128;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_108;
  double dStack_100;
  double local_f8;
  ChVector<double> local_f0;
  ChVector<double> local_d8 [3];
  double local_88;
  double dStack_80;
  double local_78;
  ChVector<double> local_68;
  ChVector<double> local_48;
  
  iVar3 = (*(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar3 != '\0') {
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,(ulong)off_L
                       );
    this->m_multipliers[0] = *pdVar4;
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                        (ulong)(off_L + 1));
    this->m_multipliers[1] = *pdVar4;
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                        (ulong)(off_L + 2));
    this->m_multipliers[2] = *pdVar4;
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                        (ulong)(off_L + 3));
    this->m_multipliers[3] = *pdVar4;
    pdVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)L,
                        (ulong)(off_L + 4));
    local_138 = *pdVar4;
    this->m_multipliers[4] = local_138;
    uStack_130 = 0;
    local_68.m_data[2] = this->m_multipliers[2];
    local_68.m_data[0] = this->m_multipliers[0];
    local_68.m_data[1] = this->m_multipliers[1];
    local_148 = this->m_multipliers[3];
    local_d8[0].m_data[0] =
         (double)&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                  Amatrix;
    uStack_140 = 0;
    chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_d8,&local_68);
    pCVar1 = &(this->m_frame2).Amatrix;
    local_108.m_matrix = &pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>;
    chrono::operator*(&local_108,&local_48);
    if (local_d8 != &(this->super_ChLink).react_force) {
      (this->super_ChLink).react_force.m_data[0] = local_d8[0].m_data[0];
      (this->super_ChLink).react_force.m_data[1] = local_d8[0].m_data[1];
      (this->super_ChLink).react_force.m_data[2] = local_d8[0].m_data[2];
    }
    local_d8[0].m_data[0] =
         (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
    local_d8[0].m_data[1] =
         (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
    local_d8[0].m_data[2] =
         (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
    ChMatrix33<double>::operator*
              (&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
                Amatrix,local_d8);
    local_d8[0].m_data[0] =
         (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
    local_d8[0].m_data[1] =
         (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
    local_d8[0].m_data[2] =
         (this->m_frame1).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
    ChMatrix33<double>::operator*
              (&(((this->super_ChLink).Body1)->super_ChFrameMoving<double>).super_ChFrame<double>.
                Amatrix,local_d8);
    local_f0.m_data[1] = (double)&this->m_w2_tilde;
    local_f0.m_data[0] =
         (double)&(((this->super_ChLink).Body2)->super_ChFrameMoving<double>).super_ChFrame<double>.
                  Amatrix;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)local_d8,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                *)&local_f0);
    local_128.m_data[2] = local_148 * local_f8 + local_138 * local_78;
    local_128.m_data[0] = local_148 * (double)local_108.m_matrix + local_138 * local_88;
    local_128.m_data[1] = local_148 * dStack_100 + local_138 * dStack_80;
    local_150.m_matrix = (non_const_type)local_d8;
    chrono::operator*(&local_150,&local_128);
    local_150.m_matrix = &pCVar1->super_Matrix<double,_3,_3,_1,_3,_3>;
    chrono::operator*(&local_150,&local_f0);
    auVar5._0_8_ = -local_128.m_data[2];
    auVar5._8_4_ = 0;
    auVar5._12_4_ = 0x80000000;
    *(undefined4 *)(this->super_ChLink).react_torque.m_data = local_128.m_data[0]._0_4_;
    *(uint *)((long)(this->super_ChLink).react_torque.m_data + 4) =
         local_128.m_data[0]._4_4_ ^ 0x80000000;
    *(undefined4 *)((this->super_ChLink).react_torque.m_data + 1) = local_128.m_data[1]._0_4_;
    *(uint *)((long)(this->super_ChLink).react_torque.m_data + 0xc) =
         local_128.m_data[1]._4_4_ ^ 0x80000000;
    dVar2 = (double)vmovlps_avx(auVar5);
    (this->super_ChLink).react_torque.m_data[2] = dVar2;
  }
  return;
}

Assistant:

void ChLinkRevolute::IntStateScatterReactions(const unsigned int off_L, const ChVectorDynamic<>& L) {
    if (!this->IsActive())
        return;

    m_multipliers[0] = L(off_L + 0);
    m_multipliers[1] = L(off_L + 1);
    m_multipliers[2] = L(off_L + 2);
    m_multipliers[3] = L(off_L + 3);
    m_multipliers[4] = L(off_L + 4);

    // Also compute 'intuitive' reactions:
    ChVector<> lam_sph(m_multipliers[0], m_multipliers[1], m_multipliers[2]);
    double lam_uw = m_multipliers[3];
    double lam_vw = m_multipliers[4];

    // Calculate the reaction force and torque acting on the 2nd body at the joint
    // location, expressed in the joint reference frame.  Taking into account the
    // sign with which Lagrange multipliers show up in the EOM in Chrono, we get:
    //   F = C^T * A_2^T * Phi_r2^T * lam
    //   T = C^T * ( Phi_pi2^T - tilde(s2') * A_2^T * Phi_r2^T ) * lam
    // For the revolute joint, after some manipulations, we have:
    //   F = C^T * A_2^T * lam_sph
    //   T = C^T * tilde(w2') *A_2^T * (u1 * lam_uw + v1 * lam_vw)
    //     = -C^T * [A_2 * tilde(w2')]^T * (u1 * lam_uw + v1 * lam_vw)

    // Reaction force
    ChVector<> F2 = Body2->GetA().transpose() * lam_sph;
    react_force = m_frame2.GetA().transpose() * F2;

    // Reaction torque
    ChVector<> u1 = Body1->TransformDirectionLocalToParent(m_frame1.GetA().Get_A_Xaxis());
    ChVector<> v1 = Body1->TransformDirectionLocalToParent(m_frame1.GetA().Get_A_Yaxis());
    ChMatrix33<> mat2 = Body2->GetA() * m_w2_tilde;
    ChVector<> T2 = mat2.transpose() * (lam_uw * u1 + lam_vw * v1);
    react_torque = -(m_frame2.GetA().transpose() * T2);
}